

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

SolveStrategy *
Clasp::ClaspFacade::SolveStrategy::create(SolveMode_t m,ClaspFacade *f,SolveAlgorithm *algo)

{
  uint uVar1;
  ClaspFacade *pCVar2;
  undefined8 in_RDX;
  E in_EDI;
  SolveAlgorithm *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  SolveMode_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  SolveMode_t m_00;
  SolveMode_t local_c;
  ClaspFacade *local_8;
  
  m_00.val_ = (E)((ulong)in_RDX >> 0x20);
  local_c.val_ = in_EDI;
  uVar1 = SolveMode_t::operator_cast_to_unsigned_int(&local_c);
  if ((uVar1 & 1) == 0) {
    pCVar2 = (ClaspFacade *)operator_new(0x58);
    SolveStrategy((SolveStrategy *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                  in_stack_ffffffffffffffd4,pCVar2,in_stack_ffffffffffffffb8);
    local_8 = pCVar2;
  }
  else {
    pCVar2 = (ClaspFacade *)operator_new(0xb8);
    Async::Async((Async *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),m_00,
                 (ClaspFacade *)CONCAT44(in_stack_ffffffffffffffd4.val_,in_stack_ffffffffffffffd0),
                 (SolveAlgorithm *)CONCAT44(in_stack_ffffffffffffffcc,local_c.val_));
    local_8 = pCVar2;
  }
  return (SolveStrategy *)local_8;
}

Assistant:

ClaspFacade::SolveStrategy* ClaspFacade::SolveStrategy::create(SolveMode_t m, ClaspFacade& f, SolveAlgorithm& algo) {
	if ((m & SolveMode_t::Async) == 0) { return new SolveStrategy(m, f, &algo); }
#if CLASP_HAS_THREADS
	return new SolveStrategy::Async(m, f, &algo);
#else
	POTASSCO_REQUIRE(CLASP_HAS_THREADS, "Solve mode not supported!");
#endif
}